

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFUsedFont.cpp
# Opt level: O0

double __thiscall
PDFUsedFont::CalculateTextAdvance(PDFUsedFont *this,UIntList *inGlyphsList,double inFontSize)

{
  bool bVar1;
  reference puVar2;
  size_type sVar3;
  mapped_type_conflict1 *pmVar4;
  long local_40;
  FT_Pos adv;
  _Self local_30;
  const_iterator it;
  FT_Pos pen;
  double inFontSize_local;
  UIntList *inGlyphsList_local;
  PDFUsedFont *this_local;
  
  it._M_node = (_List_node_base *)0x0;
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::begin(inGlyphsList);
  while( true ) {
    adv = (FT_Pos)std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::end(inGlyphsList)
    ;
    bVar1 = std::operator!=(&local_30,(_Self *)&adv);
    if (!bVar1) break;
    puVar2 = std::_List_const_iterator<unsigned_int>::operator*(&local_30);
    sVar3 = std::
            map<unsigned_int,_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
            ::count(&this->mAdvanceCache,puVar2);
    if (sVar3 == 0) {
      puVar2 = std::_List_const_iterator<unsigned_int>::operator*(&local_30);
      local_40 = FreeTypeFaceWrapper::GetGlyphWidth(&this->mFaceWrapper,*puVar2);
      sVar3 = std::
              map<unsigned_int,_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
              ::size(&this->mAdvanceCache);
      if (sVar3 < 0xc9) {
        puVar2 = std::_List_const_iterator<unsigned_int>::operator*(&local_30);
        pmVar4 = std::
                 map<unsigned_int,_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
                 ::operator[](&this->mAdvanceCache,puVar2);
        *pmVar4 = local_40;
      }
    }
    else {
      puVar2 = std::_List_const_iterator<unsigned_int>::operator*(&local_30);
      pmVar4 = std::
               map<unsigned_int,_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
               ::operator[](&this->mAdvanceCache,puVar2);
      local_40 = *pmVar4;
    }
    it._M_node = (_List_node_base *)((long)&(it._M_node)->_M_next + local_40);
    std::_List_const_iterator<unsigned_int>::operator++(&local_30);
  }
  return ((double)(long)it._M_node * inFontSize) / 1000.0;
}

Assistant:

double PDFUsedFont::CalculateTextAdvance(const UIntList& inGlyphsList,double inFontSize)
{
    FT_Pos pen = 0;
    UIntList::const_iterator it = inGlyphsList.begin();
    for(; it != inGlyphsList.end();++it)
    {
		FT_Pos adv;
		if (mAdvanceCache.count(*it) > 0) 
			adv = mAdvanceCache[*it];
		else {
			adv = mFaceWrapper.GetGlyphWidth(*it); //potentially very expensive!
			if (mAdvanceCache.size() <= AdvanceCacheLimit) //dumb limit should cover typical usage, implement LRU if it's a problem
				mAdvanceCache[*it] = adv;
		}
		pen += adv;
    }
	return pen * inFontSize / 1000.0;
}